

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O3

ssize_t __thiscall cppwinrt::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  char *pcVar2;
  visit_overload<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_type_writers_h:472:17),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_type_writers_h:517:17),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_type_writers_h:521:21)>
  local_18;
  
  pcVar2 = (char *)CONCAT44(in_register_00000034,__fd);
  if ((this->abi_types == false) && (*pcVar2 == '\x01')) {
    local_18.super_anon_class_8_1_8991fb9c.this = (writer *)0xc;
    local_18.super_anon_class_8_1_8991fb9c.this = (writer *)0x17760c;
    writer_base<cppwinrt::writer>::
    write_segment<std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>>
              (&this->super_writer_base<cppwinrt::writer>,(string_view *)&local_18,
               (variant<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                *)(pcVar2 + 0x28));
    sVar1 = extraout_RAX;
  }
  else {
    local_18.super_anon_class_8_1_8991fb9c.this = this;
    local_18.super_anon_class_8_1_8991fb9c.this = this;
    local_18.super_anon_class_8_1_8991fb9c.this = this;
    std::
    visit<cppwinrt::visit_overload<cppwinrt::writer::write(std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>const&)::_lambda(winmd::reader::ElementType)_1_,cppwinrt::writer::write(std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>const&)::_lambda(winmd::reader::GenericTypeIndex)_1_,cppwinrt::writer::write(std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>const&)::_lambda(auto:1&&)_1_>,std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>const&>
              (&local_18,
               (variant<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                *)(pcVar2 + 0x28));
    sVar1 = extraout_RAX_00;
  }
  return sVar1;
}

Assistant:

void write(TypeSig const& signature)
        {
            if (!abi_types && signature.is_szarray())
            {
                write("com_array<%>", signature.Type());
            }
            else
            {
                write(signature.Type());
            }
        }